

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O2

LY_ERR lyd_new_ext_list(lysc_ext_instance *ext,char *name,uint32_t options,lyd_node **node,...)

{
  LY_VALUE_FORMAT format_00;
  uint uVar1;
  char in_AL;
  LY_ERR LVar2;
  lysc_node *plVar3;
  ulong uVar4;
  size_t value_len;
  uint *puVar5;
  undefined8 *puVar6;
  byte store_only;
  ly_ctx *ctx;
  undefined8 in_R8;
  char *pcVar7;
  undefined8 in_R9;
  lyd_node *node_00;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  LY_VALUE_FORMAT format;
  va_list ap;
  lyd_node *local_f8;
  lyd_node *key;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_f8 = (lyd_node *)0x0;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (ext == (lysc_ext_instance *)0x0) {
    pcVar7 = "ext";
    ctx = (ly_ctx *)0x0;
  }
  else {
    ctx = ext->module->ctx;
    if (node == (lyd_node **)0x0) {
      pcVar7 = "node";
    }
    else if (name == (char *)0x0) {
      pcVar7 = "name";
    }
    else {
      LVar2 = lyd_new_val_get_format(options,&format);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      store_only = (byte)options >> 1 & 1;
      if ((store_only == 0) || ((format != LY_VALUE_LYB && (format != LY_VALUE_CANON)))) {
        plVar3 = lysc_ext_find_node(ext,(lys_module *)0x0,name,0,0x10,0);
        if (plVar3 == (lysc_node *)0x0) {
          pcVar7 = ext->def->name;
          if (ext->argument == (char *)0x0) {
            ly_log(ctx,LY_LLERR,LY_EINVAL,"List node \"%s\" not found in instance of extension %s.",
                   name,pcVar7);
          }
          else {
            ly_log(ctx,LY_LLERR,LY_EINVAL,
                   "List node \"%s\" not found in instance \"%s\" of extension %s.",name,
                   ext->argument,pcVar7);
          }
          return LY_ENOTFOUND;
        }
        LVar2 = lyd_create_inner(plVar3,&local_f8);
        if (LVar2 != LY_SUCCESS) {
          return LY_EMEM;
        }
        ap[0].reg_save_area = local_e8;
        ap[0].overflow_arg_area = &stack0x00000008;
        ap[0].gp_offset = 0x20;
        ap[0].fp_offset = 0x30;
        plVar3 = lysc_node_child(plVar3);
        node_00 = local_f8;
        do {
          format_00 = format;
          if ((plVar3 == (lysc_node *)0x0) || ((plVar3->flags & 0x100) == 0)) {
            LVar2 = LY_SUCCESS;
LAB_0012a178:
            *node = node_00;
            return LVar2;
          }
          uVar1 = ap[0].gp_offset;
          uVar4 = ap[0]._0_8_ & 0xffffffff;
          if (format == LY_VALUE_LYB) {
            if (ap[0].gp_offset < 0x29) {
              ap[0].gp_offset = (uint)(uVar4 + 8);
              pcVar7 = *(char **)((long)ap[0].reg_save_area + uVar4);
              if (0x20 < uVar1) goto LAB_0012a0bb;
              ap[0].gp_offset = uVar1 + 0x10;
              puVar5 = (uint *)(uVar4 + 8 + (long)ap[0].reg_save_area);
            }
            else {
              pcVar7 = *ap[0].overflow_arg_area;
              ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
LAB_0012a0bb:
              puVar5 = (uint *)ap[0].overflow_arg_area;
              ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
            }
            value_len = (size_t)*puVar5;
          }
          else {
            if (ap[0].gp_offset < 0x29) {
              ap[0].gp_offset = ap[0].gp_offset + 8;
              puVar6 = (undefined8 *)(uVar4 + (long)ap[0].reg_save_area);
            }
            else {
              puVar6 = (undefined8 *)ap[0].overflow_arg_area;
              ap[0].overflow_arg_area = (void *)((long)ap[0].overflow_arg_area + 8);
            }
            pcVar7 = (char *)*puVar6;
            if (pcVar7 == (char *)0x0) {
              value_len = 0;
              pcVar7 = (char *)0x0;
            }
            else {
              value_len = strlen(pcVar7);
            }
          }
          LVar2 = lyd_create_term(plVar3,pcVar7,value_len,'\0',store_only,(ly_bool *)0x0,format_00,
                                  (void *)0x0,0x3f3,(ly_bool *)0x0,&key);
          if (LVar2 != LY_SUCCESS) {
            lyd_free_tree(node_00);
            node_00 = (lyd_node *)0x0;
            goto LAB_0012a178;
          }
          lyd_insert_node(node_00,(lyd_node **)0x0,key,1);
          plVar3 = plVar3->next;
        } while( true );
      }
      pcVar7 = "!(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB))";
    }
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar7,"lyd_new_ext_list");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_list(const struct lysc_ext_instance *ext, const char *name, uint32_t options, struct lyd_node **node, ...)
{
    struct lyd_node *ret = NULL, *key;
    const struct lysc_node *schema, *key_s;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;
    va_list ap;
    const char *key_val;
    size_t key_len;
    LY_ERR rc = LY_SUCCESS;
    ly_bool store_only = (options & LYD_NEW_VAL_STORE_ONLY) ? 1 : 0;
    LY_VALUE_FORMAT format;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);
    LY_CHECK_RET(lyd_new_val_get_format(options, &format));
    LY_CHECK_ARG_RET(ctx, !(store_only && (format == LY_VALUE_CANON || format == LY_VALUE_LYB)), LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYS_LIST, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "List node \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "List node \"%s\" not found in instance of extension %s.", name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    /* create list inner node */
    LY_CHECK_RET(lyd_create_inner(schema, &ret));

    va_start(ap, node);

    /* create and insert all the keys */
    for (key_s = lysc_node_child(schema); key_s && (key_s->flags & LYS_KEY); key_s = key_s->next) {
        if (format == LY_VALUE_LYB) {
            key_val = va_arg(ap, const void *);
            key_len = va_arg(ap, uint32_t);
        } else {
            key_val = va_arg(ap, const char *);
            key_len = key_val ? strlen((char *)key_val) : 0;
        }
        rc = lyd_create_term(key_s, key_val, key_len, 0, store_only, NULL, format, NULL, LYD_HINT_DATA, NULL, &key);
        LY_CHECK_GOTO(rc, cleanup);
        lyd_insert_node(ret, NULL, key, LYD_INSERT_NODE_LAST);
    }

cleanup:
    va_end(ap);
    if (rc) {
        lyd_free_tree(ret);
        ret = NULL;
    }
    *node = ret;
    return rc;
}